

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus checkOption(HighsLogOptions *report_log_options,OptionRecordDouble *option)

{
  HighsLogOptions *log_options_;
  undefined8 uVar1;
  long in_RSI;
  char *in_RDI;
  double value;
  OptionStatus local_4;
  
  if (*(double *)(in_RSI + 0x60) < *(double *)(in_RSI + 0x68) ||
      *(double *)(in_RSI + 0x60) == *(double *)(in_RSI + 0x68)) {
    if ((*(double *)(in_RSI + 0x70) < *(double *)(in_RSI + 0x60)) ||
       (*(double *)(in_RSI + 0x68) <= *(double *)(in_RSI + 0x70) &&
        *(double *)(in_RSI + 0x70) != *(double *)(in_RSI + 0x68))) {
      uVar1 = std::__cxx11::string::c_str();
      highsLogUser(*(HighsLogOptions **)(in_RSI + 0x70),*(HighsLogType *)(in_RSI + 0x60),
                   *(char **)(in_RSI + 0x68),in_RDI,5,
                   "checkOption: Option \"%s\" has default value %g inconsistent with bounds [%g, %g]\n"
                   ,uVar1);
      local_4 = kIllegalValue;
    }
    else {
      log_options_ = (HighsLogOptions *)**(undefined8 **)(in_RSI + 0x58);
      if (((double)log_options_ < *(double *)(in_RSI + 0x60)) ||
         (*(double *)(in_RSI + 0x68) <= (double)log_options_ &&
          (double)log_options_ != *(double *)(in_RSI + 0x68))) {
        uVar1 = std::__cxx11::string::c_str();
        highsLogUser(log_options_,*(HighsLogType *)(in_RSI + 0x60),*(char **)(in_RSI + 0x68),in_RDI,
                     5,"checkOption: Option \"%s\" has value %g inconsistent with bounds [%g, %g]\n"
                     ,uVar1);
        local_4 = kIllegalValue;
      }
      else {
        local_4 = kOk;
      }
    }
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser(*(HighsLogOptions **)(in_RSI + 0x60),*(HighsLogType *)(in_RSI + 0x68),in_RDI,5,
                 "checkOption: Option \"%s\" has inconsistent bounds [%g, %g]\n",uVar1);
    local_4 = kIllegalValue;
  }
  return local_4;
}

Assistant:

OptionStatus checkOption(const HighsLogOptions& report_log_options,
                         const OptionRecordDouble& option) {
  if (option.lower_bound > option.upper_bound) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "checkOption: Option \"%s\" has inconsistent bounds [%g, %g]\n",
        option.name.c_str(), option.lower_bound, option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  if (option.default_value < option.lower_bound ||
      option.default_value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "checkOption: Option \"%s\" has default value %g "
                 "inconsistent with bounds [%g, %g]\n",
                 option.name.c_str(), option.default_value, option.lower_bound,
                 option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  double value = *option.value;
  if (value < option.lower_bound || value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "checkOption: Option \"%s\" has value %g inconsistent with "
                 "bounds [%g, %g]\n",
                 option.name.c_str(), value, option.lower_bound,
                 option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}